

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

bool __thiscall Func::IsTrackCompoundedIntOverflowDisabled(Func *this)

{
  bool bVar1;
  JITTimeProfileInfo *this_00;
  Func *this_local;
  
  bVar1 = HasProfileInfo(this);
  if (bVar1) {
    this_00 = GetReadOnlyProfileInfo(this);
    bVar1 = JITTimeProfileInfo::IsTrackCompoundedIntOverflowDisabled(this_00);
    if (bVar1) {
      return true;
    }
  }
  bVar1 = JITOutput::IsTrackCompoundedIntOverflowDisabled(&this->m_output);
  return bVar1;
}

Assistant:

bool
Func::IsTrackCompoundedIntOverflowDisabled() const
{
    return (HasProfileInfo() && GetReadOnlyProfileInfo()->IsTrackCompoundedIntOverflowDisabled()) || m_output.IsTrackCompoundedIntOverflowDisabled();
}